

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

string * __thiscall
ICM::to_string_code<10ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string to_string_code(ConstDataPointer data) {
		return TypeBase::to_string_code<typename TType<_TU>::Type>(*get<_TU>((void*)data));
	}